

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

void nullcClean(void)

{
  CompilerContext *pCVar1;
  int iVar2;
  TraceScope traceScope;
  TraceScope TStack_18;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (nullcClean::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcClean::token);
      if (iVar2 != 0) {
        nullcClean::token = NULLC::TraceGetToken("nullc","nullcClean");
        __cxa_guard_release(&nullcClean::token);
      }
    }
    NULLC::TraceScope::TraceScope(&TStack_18,nullcClean::token);
    Linker::CleanCode(NULLC::linker);
    ExecutorX86::ClearNative(NULLC::executorX86);
    ExecutorRegVm::ClearBreakpoints(NULLC::executorRegVm);
    pCVar1 = NULLC::compilerCtx;
    NULLC::nullcLastError = "";
    if (NULLC::compilerCtx != (CompilerContext *)0x0) {
      CompilerContext::~CompilerContext(NULLC::compilerCtx);
      (*(code *)NULLC::dealloc)(pCVar1);
    }
    NULLC::compilerCtx = (CompilerContext *)0x0;
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    NULLC::TraceScope::~TraceScope(&TStack_18);
  }
  return;
}

Assistant:

void nullcClean()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)0);

	TRACE_SCOPE("nullc", "nullcClean");

#ifndef NULLC_NO_EXECUTOR
	linker->CleanCode();

	#ifdef NULLC_BUILD_X86_JIT
	executorX86->ClearNative();
	#endif

	executorRegVm->ClearBreakpoints();
#endif

	nullcLastError = "";

	NULLC::destruct(compilerCtx);
	compilerCtx = NULL;

	allocator.Clear();
}